

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O1

bool __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::is_defined(tag_t<cfgfile::string_trait_t> *this)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  bool bVar5;
  
  iVar3 = (*this->_vptr_tag_t[2])();
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  for (puVar4 = *(undefined8 **)CONCAT44(extraout_var,iVar3); bVar5 = puVar4 == puVar1, !bVar5;
      puVar4 = puVar4 + 1) {
    if (((tag_t<cfgfile::string_trait_t> *)*puVar4)->m_is_mandatory == true) {
      bVar2 = is_defined((tag_t<cfgfile::string_trait_t> *)*puVar4);
      if (!bVar2) break;
    }
  }
  return (bool)(bVar5 & this->m_is_defined);
}

Assistant:

bool is_defined() const
	{
		for( const tag_t< Trait > * tag : children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				return false;
		}

		return m_is_defined;
	}